

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O1

shared_ptr<Pipeline> __thiscall
anon_unknown.dwarf_34c1e4::ImageOptimizer::makePipeline
          (ImageOptimizer *this,string *description,Pipeline *next)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ulong uVar2;
  pointer pcVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  bool bVar6;
  int iVar7;
  longlong lVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_07;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_08;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_09;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var9;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_13;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_14;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_15;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_16;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_17;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_18;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_19;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_20;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_21;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_22;
  double dVar11;
  shared_ptr<Pipeline> sVar12;
  J_COLOR_SPACE cs;
  int components;
  string colorspace;
  uint local_124;
  uint local_120;
  undefined1 local_119;
  QPDFObjectHandle h_obj;
  QPDFObjectHandle w_obj;
  QPDFObjectHandle dict;
  undefined1 local_e8 [24];
  QPDFObjectHandle components_obj;
  QPDFObjectHandle colorspace_obj;
  Pipeline *next_local;
  _Any_data local_a8;
  code *local_98;
  code *pcStack_90;
  _Any_data local_88;
  code *local_78;
  code *pcStack_70;
  _Any_data local_68;
  code *local_58;
  code *pcStack_50;
  _Any_data local_48;
  code *local_38;
  code *pcStack_30;
  CompressConfig *local_28;
  
  (this->super_StreamDataProvider)._vptr_StreamDataProvider = (_func_int **)0x0;
  *(undefined8 *)&(this->super_StreamDataProvider).supports_retry = 0;
  QPDFObjectHandle::getDict(&dict);
  paVar1 = &colorspace.field_2;
  colorspace._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&colorspace,"/Width","");
  QPDFObjectHandle::getKey(&w_obj,(string *)&dict);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)colorspace._M_dataplus._M_p != paVar1) {
    operator_delete(colorspace._M_dataplus._M_p,
                    CONCAT71(colorspace.field_2._M_allocated_capacity._1_7_,
                             colorspace.field_2._M_local_buf[0]) + 1);
  }
  colorspace._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&colorspace,"/Height","");
  QPDFObjectHandle::getKey(&h_obj,(string *)&dict);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)colorspace._M_dataplus._M_p != paVar1) {
    operator_delete(colorspace._M_dataplus._M_p,
                    CONCAT71(colorspace.field_2._M_allocated_capacity._1_7_,
                             colorspace.field_2._M_local_buf[0]) + 1);
  }
  colorspace._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&colorspace,"/ColorSpace","");
  QPDFObjectHandle::getKey(&colorspace_obj,(string *)&dict);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)colorspace._M_dataplus._M_p != paVar1) {
    operator_delete(colorspace._M_dataplus._M_p,
                    CONCAT71(colorspace.field_2._M_allocated_capacity._1_7_,
                             colorspace.field_2._M_local_buf[0]) + 1);
  }
  bVar6 = QPDFObjectHandle::isNumber(&w_obj);
  _Var10._M_pi = extraout_RDX;
  if ((!bVar6) ||
     (bVar6 = QPDFObjectHandle::isNumber(&h_obj), _Var10._M_pi = extraout_RDX_00, !bVar6)) {
    if ((next->identifier)._M_dataplus._M_p != (pointer)0x0) {
      local_48._8_8_ = 0;
      pcStack_30 = std::
                   _Function_handler<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDFJob.cc:140:27)>
                   ::_M_invoke;
      local_38 = std::
                 _Function_handler<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDFJob.cc:140:27)>
                 ::_M_manager;
      local_48._M_unused._M_object = next;
      QPDFJob::doIfVerbose
                ((QPDFJob *)(description->field_2)._M_allocated_capacity,
                 (function<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                  *)&local_48);
      _Var10._M_pi = extraout_RDX_03;
      if (local_38 != (code *)0x0) {
        (*local_38)(&local_48,&local_48,__destroy_functor);
        _Var10._M_pi = extraout_RDX_04;
      }
    }
    goto LAB_00188d6d;
  }
  colorspace._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&colorspace,"/BitsPerComponent","");
  QPDFObjectHandle::getKey(&components_obj,(string *)&dict);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)colorspace._M_dataplus._M_p != paVar1) {
    operator_delete(colorspace._M_dataplus._M_p,
                    CONCAT71(colorspace.field_2._M_allocated_capacity._1_7_,
                             colorspace.field_2._M_local_buf[0]) + 1);
  }
  bVar6 = QPDFObjectHandle::isInteger(&components_obj);
  _Var10._M_pi = extraout_RDX_01;
  if ((bVar6) &&
     (lVar8 = QPDFObjectHandle::getIntValue(&components_obj), _Var10._M_pi = extraout_RDX_02,
     lVar8 == 8)) {
    local_120 = 0;
    bVar6 = QPDFObjectHandle::isInteger(&w_obj);
    if (bVar6) {
      local_120 = QPDFObjectHandle::getUIntValueAsUInt(&w_obj);
    }
    else {
      dVar11 = QPDFObjectHandle::getNumericValue(&w_obj);
      local_120 = (uint)(long)dVar11;
    }
    local_124 = 0;
    bVar6 = QPDFObjectHandle::isInteger(&h_obj);
    if (bVar6) {
      local_124 = QPDFObjectHandle::getUIntValueAsUInt(&h_obj);
    }
    else {
      dVar11 = QPDFObjectHandle::getNumericValue(&h_obj);
      local_124 = (uint)(long)dVar11;
    }
    bVar6 = QPDFObjectHandle::isName(&colorspace_obj);
    if (bVar6) {
      QPDFObjectHandle::getName_abi_cxx11_(&colorspace,&colorspace_obj);
    }
    else {
      colorspace._M_string_length = 0;
      colorspace.field_2._M_local_buf[0] = '\0';
      colorspace._M_dataplus._M_p = (pointer)paVar1;
    }
    components = 0;
    cs = JCS_UNKNOWN;
    iVar7 = std::__cxx11::string::compare((char *)&colorspace);
    if (iVar7 == 0) {
      components = 3;
      cs = JCS_RGB;
      p_Var9 = extraout_RDX_07;
LAB_00188c92:
      uVar2 = *(ulong *)((long)&description->field_2 + 8);
      _Var10._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     CONCAT71((int7)((ulong)p_Var9 >> 8),uVar2 == 0);
      if (uVar2 < local_120 || uVar2 == 0) {
        pcVar3 = description[1]._M_dataplus._M_p;
        _Var10._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       CONCAT71((int7)((ulong)pcVar3 >> 8),
                                pcVar3 < (pointer)(ulong)local_124 || pcVar3 == (pointer)0x0);
        if ((pcVar3 < (pointer)(ulong)local_124 || pcVar3 == (pointer)0x0) &&
           ((_Var10._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                            description[1]._M_string_length,
            _Var10._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0 ||
            (_Var10._M_pi <
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(ulong)(local_124 * local_120))))) {
          local_28 = (CompressConfig *)description[2]._M_string_length;
          local_e8._0_8_ = (_func_int **)0x0;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<Pl_DCT,std::allocator<Pl_DCT>,char_const(&)[4],Pipeline*&,unsigned_int&,unsigned_int&,int&,J_COLOR_SPACE&,Pl_DCT::CompressConfig*>
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_e8 + 8),
                     (Pl_DCT **)local_e8,(allocator<Pl_DCT> *)&local_119,(char (*) [4])"jpg",
                     &next_local,&local_120,&local_124,&components,&cs,&local_28);
          uVar5 = local_e8._8_8_;
          uVar4 = local_e8._0_8_;
          local_e8._0_8_ = 0;
          local_e8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          p_Var9 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                    &(this->super_StreamDataProvider).supports_retry;
          (this->super_StreamDataProvider)._vptr_StreamDataProvider = (_func_int **)uVar4;
          *(undefined8 *)&(this->super_StreamDataProvider).supports_retry = uVar5;
          _Var10._M_pi = extraout_RDX_20;
          if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var9);
            _Var10._M_pi = extraout_RDX_21;
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_);
            _Var10._M_pi = extraout_RDX_22;
          }
          goto LAB_00188d44;
        }
      }
      if ((next->identifier)._M_dataplus._M_p != (pointer)0x0) {
        local_a8._8_8_ = 0;
        pcStack_90 = std::
                     _Function_handler<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDFJob.cc:199:27)>
                     ::_M_invoke;
        local_98 = std::
                   _Function_handler<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDFJob.cc:199:27)>
                   ::_M_manager;
        local_a8._M_unused._M_object = next;
        QPDFJob::doIfVerbose
                  ((QPDFJob *)(description->field_2)._M_allocated_capacity,
                   (function<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                    *)&local_a8);
        _Var10._M_pi = extraout_RDX_12;
        if (local_98 != (code *)0x0) {
          (*local_98)(&local_a8,&local_a8,__destroy_functor);
          _Var10._M_pi = extraout_RDX_13;
        }
      }
    }
    else {
      iVar7 = std::__cxx11::string::compare((char *)&colorspace);
      if (iVar7 == 0) {
        cs = JCS_GRAYSCALE;
        p_Var9 = extraout_RDX_08;
        components = cs;
        goto LAB_00188c92;
      }
      iVar7 = std::__cxx11::string::compare((char *)&colorspace);
      if (iVar7 == 0) {
        cs = JCS_CMYK;
        p_Var9 = extraout_RDX_09;
        components = cs;
        goto LAB_00188c92;
      }
      _Var10._M_pi = extraout_RDX_09;
      if ((next->identifier)._M_dataplus._M_p != (pointer)0x0) {
        local_88._8_8_ = 0;
        pcStack_70 = std::
                     _Function_handler<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDFJob.cc:187:27)>
                     ::_M_invoke;
        local_78 = std::
                   _Function_handler<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDFJob.cc:187:27)>
                   ::_M_manager;
        local_88._M_unused._M_object = next;
        QPDFJob::doIfVerbose
                  ((QPDFJob *)(description->field_2)._M_allocated_capacity,
                   (function<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                    *)&local_88);
        _Var10._M_pi = extraout_RDX_10;
        if (local_78 != (code *)0x0) {
          (*local_78)(&local_88,&local_88,__destroy_functor);
          _Var10._M_pi = extraout_RDX_11;
        }
      }
    }
LAB_00188d44:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)colorspace._M_dataplus._M_p != paVar1) {
      operator_delete(colorspace._M_dataplus._M_p,
                      CONCAT71(colorspace.field_2._M_allocated_capacity._1_7_,
                               colorspace.field_2._M_local_buf[0]) + 1);
      _Var10._M_pi = extraout_RDX_14;
    }
  }
  else if ((next->identifier)._M_dataplus._M_p != (pointer)0x0) {
    local_68._8_8_ = 0;
    pcStack_50 = std::
                 _Function_handler<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDFJob.cc:151:27)>
                 ::_M_invoke;
    local_58 = std::
               _Function_handler<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDFJob.cc:151:27)>
               ::_M_manager;
    local_68._M_unused._M_object = next;
    QPDFJob::doIfVerbose
              ((QPDFJob *)(description->field_2)._M_allocated_capacity,
               (function<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                *)&local_68);
    _Var10._M_pi = extraout_RDX_05;
    if (local_58 != (code *)0x0) {
      (*local_58)(&local_68,&local_68,__destroy_functor);
      _Var10._M_pi = extraout_RDX_06;
    }
  }
  if (components_obj.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (components_obj.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    _Var10._M_pi = extraout_RDX_15;
  }
LAB_00188d6d:
  if (colorspace_obj.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (colorspace_obj.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    _Var10._M_pi = extraout_RDX_16;
  }
  if (h_obj.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (h_obj.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
    _Var10._M_pi = extraout_RDX_17;
  }
  if (w_obj.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (w_obj.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
    _Var10._M_pi = extraout_RDX_18;
  }
  if (dict.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (dict.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    _Var10._M_pi = extraout_RDX_19;
  }
  sVar12.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var10._M_pi;
  sVar12.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<Pipeline>)sVar12.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Pipeline>
ImageOptimizer::makePipeline(std::string const& description, Pipeline* next)
{
    std::shared_ptr<Pipeline> result;
    QPDFObjectHandle dict = image.getDict();
    QPDFObjectHandle w_obj = dict.getKey("/Width");
    QPDFObjectHandle h_obj = dict.getKey("/Height");
    QPDFObjectHandle colorspace_obj = dict.getKey("/ColorSpace");
    if (!(w_obj.isNumber() && h_obj.isNumber())) {
        if (!description.empty()) {
            o.doIfVerbose([&](Pipeline& v, std::string const& prefix) {
                v << prefix << ": " << description
                  << ": not optimizing because image dictionary is missing required keys\n";
            });
        }
        return result;
    }
    QPDFObjectHandle components_obj = dict.getKey("/BitsPerComponent");
    if (!(components_obj.isInteger() && (components_obj.getIntValue() == 8))) {
        QTC::TC("qpdf", "QPDFJob image optimize bits per component");
        if (!description.empty()) {
            o.doIfVerbose([&](Pipeline& v, std::string const& prefix) {
                v << prefix << ": " << description
                  << ": not optimizing because image has other than 8 bits per component\n";
            });
        }
        return result;
    }
    // Files have been seen in the wild whose width and height are floating point, which is goofy,
    // but we can deal with it.
    JDIMENSION w = 0;
    if (w_obj.isInteger()) {
        w = w_obj.getUIntValueAsUInt();
    } else {
        w = static_cast<JDIMENSION>(w_obj.getNumericValue());
    }
    JDIMENSION h = 0;
    if (h_obj.isInteger()) {
        h = h_obj.getUIntValueAsUInt();
    } else {
        h = static_cast<JDIMENSION>(h_obj.getNumericValue());
    }
    std::string colorspace = (colorspace_obj.isName() ? colorspace_obj.getName() : std::string());
    int components = 0;
    J_COLOR_SPACE cs = JCS_UNKNOWN;
    if (colorspace == "/DeviceRGB") {
        components = 3;
        cs = JCS_RGB;
    } else if (colorspace == "/DeviceGray") {
        components = 1;
        cs = JCS_GRAYSCALE;
    } else if (colorspace == "/DeviceCMYK") {
        components = 4;
        cs = JCS_CMYK;
    } else {
        QTC::TC("qpdf", "QPDFJob image optimize colorspace");
        if (!description.empty()) {
            o.doIfVerbose([&](Pipeline& v, std::string const& prefix) {
                v << prefix << ": " << description
                  << ": not optimizing because qpdf can't optimize images with this colorspace\n";
            });
        }
        return result;
    }
    if (((this->oi_min_width > 0) && (w <= this->oi_min_width)) ||
        ((this->oi_min_height > 0) && (h <= this->oi_min_height)) ||
        ((this->oi_min_area > 0) && ((w * h) <= this->oi_min_area))) {
        QTC::TC("qpdf", "QPDFJob image optimize too small");
        if (!description.empty()) {
            o.doIfVerbose([&](Pipeline& v, std::string const& prefix) {
                v << prefix << ": " << description
                  << ": not optimizing because image is smaller than requested minimum "
                     "dimensions\n";
            });
        }
        return result;
    }

    result = std::make_shared<Pl_DCT>("jpg", next, w, h, components, cs, config.get());
    return result;
}